

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_symbols.hpp
# Opt level: O3

Elf_Xword __thiscall
ELFIO::symbol_section_accessor_template<ELFIO::section>::
generic_arrange_local_symbols<ELFIO::Elf32_Sym>
          (symbol_section_accessor_template<ELFIO::section> *this,
          function<void_(unsigned_long,_unsigned_long)> *func)

{
  Elf32_Addr EVar1;
  Elf_Word EVar2;
  uchar uVar3;
  uchar uVar4;
  Elf_Half EVar5;
  Elf_Xword EVar6;
  Elf32_Sym *pEVar7;
  Elf32_Sym *pEVar8;
  Elf_Xword index;
  ulong index_00;
  Elf_Word first_not_local;
  uint local_5c;
  unsigned_long local_58;
  undefined8 uStack_50;
  _Any_data *local_40;
  Elf_Xword local_38;
  
  local_5c = 1;
  EVar6 = get_symbols_num(this);
  index_00 = 1;
  local_40 = (_Any_data *)func;
  do {
    if (index_00 < EVar6) {
      do {
        pEVar7 = generic_get_symbol_ptr<ELFIO::Elf32_Sym>(this,index_00);
        if (0xf < pEVar7->st_info) break;
        local_5c = (int)index_00 + 1;
        index_00 = (ulong)local_5c;
      } while (index_00 < EVar6);
    }
    else {
      pEVar7 = (Elf32_Sym *)0x0;
    }
    index = (Elf_Xword)((int)index_00 + 1);
    if (EVar6 <= index) {
LAB_00108849:
      (*this->symbol_section->_vptr_section[10])(this->symbol_section,&local_5c);
      return (ulong)local_5c;
    }
    while (pEVar8 = generic_get_symbol_ptr<ELFIO::Elf32_Sym>(this,index), 0xf < pEVar8->st_info) {
      index = index + 1;
      if (EVar6 == index) goto LAB_00108849;
    }
    if (EVar6 <= index_00) goto LAB_00108849;
    if (*(long *)(local_40 + 1) != 0) {
      local_58 = index_00;
      local_38 = index;
      (**(code **)((long)local_40 + 0x18))(local_40,&local_58,&local_38);
    }
    local_58._0_4_ = pEVar7->st_name;
    local_58._4_4_ = pEVar7->st_value;
    uStack_50._0_4_ = pEVar7->st_size;
    uStack_50._4_1_ = pEVar7->st_info;
    uStack_50._5_1_ = pEVar7->st_other;
    uStack_50._6_2_ = pEVar7->st_shndx;
    EVar1 = pEVar8->st_value;
    EVar2 = pEVar8->st_size;
    uVar3 = pEVar8->st_info;
    uVar4 = pEVar8->st_other;
    EVar5 = pEVar8->st_shndx;
    pEVar7->st_name = pEVar8->st_name;
    pEVar7->st_value = EVar1;
    pEVar7->st_size = EVar2;
    pEVar7->st_info = uVar3;
    pEVar7->st_other = uVar4;
    pEVar7->st_shndx = EVar5;
    pEVar8->st_name = (undefined4)local_58;
    pEVar8->st_value = local_58._4_4_;
    pEVar8->st_size = (undefined4)uStack_50;
    pEVar8->st_info = uStack_50._4_1_;
    pEVar8->st_other = uStack_50._5_1_;
    pEVar8->st_shndx = uStack_50._6_2_;
  } while( true );
}

Assistant:

Elf_Xword generic_arrange_local_symbols(
        std::function<void( Elf_Xword first, Elf_Xword second )> func )
    {
        const endianness_convertor& convertor = elf_file.get_convertor();

        Elf_Word first_not_local =
            1; // Skip the first entry. It is always NOTYPE
        Elf_Xword current = 0;
        Elf_Xword count   = get_symbols_num();

        while ( true ) {
            T* p1 = nullptr;
            T* p2 = nullptr;

            while ( first_not_local < count ) {
                p1 = const_cast<T*>(
                    generic_get_symbol_ptr<T>( first_not_local ) );
                if ( ELF_ST_BIND( convertor( p1->st_info ) ) != STB_LOCAL )
                    break;
                ++first_not_local;
            }

            current = first_not_local + 1;
            while ( current < count ) {
                p2 = const_cast<T*>( generic_get_symbol_ptr<T>( current ) );
                if ( ELF_ST_BIND( convertor( p2->st_info ) ) == STB_LOCAL )
                    break;
                ++current;
            }

            if ( first_not_local < count && current < count ) {
                if ( func )
                    func( first_not_local, current );

                std::swap( *p1, *p2 );
            }
            else {
                // Update 'info' field of the section
                symbol_section->set_info( first_not_local );
                break;
            }
        }

        return first_not_local;
    }